

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

vm_obj_id_t __thiscall vmtz_trans::get_as_list(vmtz_trans *this)

{
  CVmObjPageEntry *this_00;
  char *__s;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t vVar3;
  size_t bytelen;
  ulong uVar4;
  vm_val_t ele;
  vm_val_t local_40;
  
  vVar3 = CVmObjList::create(0,4);
  pvVar2 = sp_;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = vVar3;
  this_00 = G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff);
  uVar4 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
  if (uVar4 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar4 - 1);
  }
  if (this->daytime == -0x80000000 && this->dayno == -0x80000000) {
    local_40.typ = VM_NIL;
  }
  else {
    local_40.val.obj = CVmObjDate::create(0,this->dayno,this->daytime);
    local_40.typ = VM_OBJ;
  }
  CVmObjList::cons_set_element((CVmObjList *)this_00,0,&local_40);
  local_40.val.obj = this->ttype->gmtofs;
  local_40.typ = VM_INT;
  CVmObjList::cons_set_element((CVmObjList *)this_00,1,&local_40);
  local_40.val.obj = this->ttype->save;
  local_40.typ = VM_INT;
  CVmObjList::cons_set_element((CVmObjList *)this_00,2,&local_40);
  __s = this->ttype->fmt;
  bytelen = strlen(__s);
  local_40.val.obj = CVmObjString::create(0,__s,bytelen);
  local_40.typ = VM_OBJ;
  CVmObjList::cons_set_element((CVmObjList *)this_00,3,&local_40);
  sp_ = sp_ + -1;
  return vVar3;
}

Assistant:

vm_obj_id_t vmtz_trans::get_as_list(VMG0_) const
{
    /* create a result list for this item - [date, ofs, save, fmt] */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, 4);
    G_stk->push()->set_obj(lstid);

    /* get the list and clear it out, since we're building it in pieces */
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* 
     *   Element [1] is the transition time as a Date object, or nil if the
     *   date is INT32MINVALs (which represents the beginning of time, for
     *   the pre-establishment settings).
     */
    vm_val_t ele;
    if (dayno == INT32MINVAL && daytime == INT32MINVAL)
        ele.set_nil();
    else
        ele.set_obj(CVmObjDate::create(vmg_ FALSE, dayno, daytime));
    lst->cons_set_element(0, &ele);

    /* element [2] is the UTC offset */
    ele.set_int(ttype->gmtofs);
    lst->cons_set_element(1, &ele);
    
    /* element [3] is the daylight savings delta */
    ele.set_int(ttype->save);
    lst->cons_set_element(2, &ele);
    
    /* element [4] is the abbreviation string */
    ele.set_obj(CVmObjString::create(
        vmg_ FALSE, ttype->fmt, strlen(ttype->fmt)));
    lst->cons_set_element(3, &ele);

    /* discard gc protection and return the list object */
    G_stk->discard(1);
    return lstid;
}